

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDefines.h
# Opt level: O0

KString * __thiscall
KDIS::GetErrorText_abi_cxx11_(KString *__return_storage_ptr__,KDIS *this,KUINT16 ErrorCode)

{
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d;
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [18];
  allocator<char> local_13;
  undefined2 local_12;
  KString *pKStack_10;
  KUINT16 ErrorCode_local;
  
  local_12 = SUB82(this,0);
  pKStack_10 = __return_storage_ptr__;
  switch((ulong)this & 0xffff) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"No Errors. ",&local_13);
    std::allocator<char>::~allocator(&local_13);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Buffer Is Too Small. ",local_25);
    std::allocator<char>::~allocator(local_25);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,
               "Buffer Does Not Contain Enough Information To Decode. ",&local_26);
    std::allocator<char>::~allocator(&local_26);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"String Size Too Big. ",&local_27);
    std::allocator<char>::~allocator(&local_27);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Data Type Is Too Large. ",&local_28);
    std::allocator<char>::~allocator(&local_28);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Incorrect PDU Type Specified In Header. ",&local_29
              );
    std::allocator<char>::~allocator(&local_29);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Could Not Open File For Reading/Writing. ",
               &local_2a);
    std::allocator<char>::~allocator(&local_2a);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,
               "Parameter Is Out Of Bounds/Range Of Acceptable Values. ",&local_2b);
    std::allocator<char>::~allocator(&local_2b);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Invalid Data. ",&local_2c);
    std::allocator<char>::~allocator(&local_2c);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Unsupported Data Type, Can Not Decode. ",&local_2d)
    ;
    std::allocator<char>::~allocator(&local_2d);
    break;
  case 10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Invalid Operation. ",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    break;
  case 0xb:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"PDU Is Too Large. PDU Must Not Exceed 8192 Bytes.",
               &local_2f);
    std::allocator<char>::~allocator(&local_2f);
    break;
  case 0xc:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Socket error.",&local_30);
    std::allocator<char>::~allocator(&local_30);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Unknown KDIS Error. ",&local_31);
    std::allocator<char>::~allocator(&local_31);
  }
  return __return_storage_ptr__;
}

Assistant:

static KString GetErrorText( KUINT16 ErrorCode )
{
    switch( ErrorCode )
    {
        case NO_ERRORS:
            return "No Errors. ";
        case BUFFER_TOO_SMALL:
            return "Buffer Is Too Small. ";
        case NOT_ENOUGH_DATA_IN_BUFFER:
            return "Buffer Does Not Contain Enough Information To Decode. ";
        case STRING_PDU_SIZE_TOO_BIG:
            return "String Size Too Big. ";
        case DATA_TYPE_TOO_LARGE:
            return "Data Type Is Too Large. ";
        case WRONG_PDU_TYPE_IN_HEADER:
            return "Incorrect PDU Type Specified In Header. ";
        case FILE_NOT_OPEN:
            return "Could Not Open File For Reading/Writing. ";
        case OUT_OF_BOUNDS:
            return "Parameter Is Out Of Bounds/Range Of Acceptable Values. ";
        case INVALID_DATA:
            return "Invalid Data. ";
        case UNSUPPORTED_DATATYPE:
            return "Unsupported Data Type, Can Not Decode. ";
        case INVALID_OPERATION:
            return "Invalid Operation. ";
        case PDU_TOO_LARGE:
            return "PDU Is Too Large. PDU Must Not Exceed 8192 Bytes.";
        case CONNECTION_SOCKET_ERROR:
            return "Socket error.";
        default:
            return "Unknown KDIS Error. ";
    }
}